

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegendreCorrFuncZ.cpp
# Opt level: O2

void __thiscall OpenMD::LegendreCorrFuncZ::postCorrelate(LegendreCorrFuncZ *this)

{
  int in_EDX;
  int extraout_EDX;
  int in_ESI;
  long lVar1;
  uint j;
  ulong uVar2;
  uint i;
  ulong uVar3;
  
  for (uVar3 = 0;
      uVar3 < (this->super_ObjectACF<OpenMD::Vector3<double>_>).
              super_AutoCorrFunc<OpenMD::Vector3<double>_>.
              super_TimeCorrFunc<OpenMD::Vector3<double>_>.nTimeBins_; uVar3 = uVar3 + 1) {
    lVar1 = 0;
    for (uVar2 = 0; uVar2 < this->nZBins_; uVar2 = uVar2 + 1) {
      if (0 < *(int *)(*(long *)&(this->counts_).
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar3].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data + uVar2 * 4)) {
        Vector<double,_3U>::div
                  ((Vector<double,_3U> *)
                   (*(long *)&(this->histogram_).
                              super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar3].
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data + lVar1),in_ESI,in_EDX);
        in_EDX = extraout_EDX;
      }
      lVar1 = lVar1 + 0x18;
    }
  }
  return;
}

Assistant:

void LegendreCorrFuncZ::postCorrelate() {
    for (unsigned int i = 0; i < nTimeBins_; ++i) {
      for (unsigned int j = 0; j < nZBins_; ++j) {
        if (counts_[i][j] > 0) { histogram_[i][j] /= counts_[i][j]; }
      }
    }
  }